

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

bool __thiscall bench::push_back_model(bench *this,string_view name)

{
  char *in_RCX;
  string_view name_00;
  optional<bench::model> mdl;
  _Optional_payload_base<bench::model> local_40;
  
  name_00._M_len = name._M_str;
  name_00._M_str = in_RCX;
  model::make_model((optional<bench::model> *)&local_40,(model *)name._M_len,name_00);
  if (local_40._M_engaged == true) {
    std::vector<bench::model,std::allocator<bench::model>>::emplace_back<bench::model&>
              ((vector<bench::model,std::allocator<bench::model>> *)this,(model *)&local_40);
  }
  std::_Optional_payload_base<bench::model>::_M_reset(&local_40);
  return local_40._M_engaged;
}

Assistant:

bool push_back_model(std::string_view name)
    {
        auto mdl = model::make_model(name);

        if (!mdl)
            return false;

        models.emplace_back(*mdl);

        return true;
    }